

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandleCompareCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  pointer pbVar2;
  __type _Var3;
  int iVar4;
  char *value;
  cmMakefile *this_00;
  string e;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"sub-command COMPARE requires a mode to be specified.","");
    cmCommand::SetError(&this->super_cmCommand,&local_50);
  }
  else {
    __rhs = pbVar1 + 1;
    iVar4 = std::__cxx11::string::compare((char *)__rhs);
    if ((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)__rhs), iVar4 != 0)) &&
        (iVar4 = std::__cxx11::string::compare((char *)__rhs), iVar4 != 0)) &&
       (((iVar4 = std::__cxx11::string::compare((char *)__rhs), iVar4 != 0 &&
         (iVar4 = std::__cxx11::string::compare((char *)__rhs), iVar4 != 0)) &&
        (iVar4 = std::__cxx11::string::compare((char *)__rhs), iVar4 != 0)))) {
      std::operator+(&local_50,"sub-command COMPARE does not recognize mode ",__rhs);
      cmCommand::SetError(&this->super_cmCommand,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return false;
      }
      goto LAB_00369df6;
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (0x80 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
      __lhs = pbVar2 + 2;
      iVar4 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((string *)__lhs);
        if (-1 < iVar4) goto LAB_00369e9c;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar4 == 0) {
          iVar4 = std::__cxx11::string::compare((string *)__lhs);
          if (0 < iVar4) goto LAB_00369e9c;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar4 == 0) {
            iVar4 = std::__cxx11::string::compare((string *)__lhs);
            if (iVar4 < 1) goto LAB_00369e9c;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar4 == 0) {
              iVar4 = std::__cxx11::string::compare((string *)__lhs);
              if (iVar4 < 0) goto LAB_00369e9c;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)__rhs);
              _Var3 = std::operator==(__lhs,pbVar2 + 3);
              if (_Var3 != (iVar4 == 0)) {
LAB_00369e9c:
                this_00 = (this->super_cmCommand).Makefile;
                value = "0";
                goto LAB_00369ed4;
              }
            }
          }
        }
      }
      this_00 = (this->super_cmCommand).Makefile;
      value = "1";
LAB_00369ed4:
      cmMakefile::AddDefinition(this_00,pbVar2 + 4,value);
      return true;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"sub-command COMPARE, mode ","");
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)pbVar1[1]._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return false;
  }
LAB_00369df6:
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmStringCommand::HandleCompareCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e = "sub-command COMPARE, mode ";
      e += mode;
      e += " needs at least 5 arguments total to command.";
      this->SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      this->Makefile->AddDefinition(outvar, "1");
    } else {
      this->Makefile->AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  this->SetError(e);
  return false;
}